

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O3

int limit_xm_resize(void *f,long n)

{
  int32 iVar1;
  char *ptr;
  
  ptr = *f;
  if (n == 0 && ptr == (char *)0x0) {
    *(undefined8 *)f = 0;
    *(undefined8 *)((long)f + 0x18) = 0;
  }
  else {
    if (*(long *)((long)f + 0x18) < n) {
      ptr = (char *)realloc(ptr,n);
      if (ptr == (char *)0x0) {
        return -1;
      }
      *(char **)f = ptr;
      memset(ptr + *(long *)((long)f + 0x18),0,n - *(long *)((long)f + 0x18));
      *(long *)((long)f + 0x18) = n;
    }
    iVar1 = dumbfile_getnc(ptr,(int32)n,*(DUMBFILE **)((long)f + 0x20));
    if (iVar1 < n) {
      return -1;
    }
  }
  *(long *)((long)f + 0x10) = n;
  *(undefined8 *)((long)f + 8) = 0;
  return 0;
}

Assistant:

static int DUMBCALLBACK limit_xm_resize(void *f, long n)
{
	DUMBFILE *df = f;
	LIMITED_XM *lx = df->file;
	if (lx->buffered || n) {
		if (n > lx->allocated) {
			unsigned char *buffered = realloc( lx->buffered, n );
			if ( !buffered ) return -1;
			lx->buffered = buffered;
			memset( buffered + lx->allocated, 0, n - lx->allocated );
			lx->allocated = n;
		}
        if ( dumbfile_getnc( (char *)lx->buffered, n, lx->remaining ) < n ) return -1;
	} else if (!n) {
		if ( lx->buffered ) free( lx->buffered );
		lx->buffered = NULL;
		lx->allocated = 0;
	}
	lx->limit = n;
	lx->ptr = 0;
	return 0;
}